

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aho-corasick-lite.cpp
# Opt level: O2

bool __thiscall Trie::loadDict(Trie *this,char *filePath)

{
  uint uVar1;
  ostream *poVar2;
  istream *piVar3;
  uchar local_27d;
  uint local_27c;
  Unicode _unicode;
  uint32_t w;
  string line;
  ifstream ifs;
  uint auStack_218 [122];
  
  std::ifstream::ifstream(&ifs,filePath,_S_in);
  local_27c = *(uint *)((long)auStack_218 + *(long *)(_ifs + -0x18));
  if ((local_27c & 5) == 0) {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    _unicode.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    _unicode.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    _unicode.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    while ((*(byte *)((long)auStack_218 + *(long *)(_ifs + -0x18)) & 2) == 0) {
      piVar3 = std::operator>>((istream *)&ifs,(string *)&line);
      std::istream::_M_extract<unsigned_int>((uint *)piVar3);
      Limonp::utf8ToUnicode(&line,&_unicode);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->weightVect,&w);
      local_27d = (uchar)((uint)((int)_unicode.
                                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (int)_unicode.
                                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 1);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&this->lengthVect,&local_27d);
      insert(this,&_unicode);
      std::istream::ignore((long)&ifs,0x40);
    }
    std::ifstream::close();
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
              (&_unicode.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
    std::__cxx11::string::~string((string *)&line);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"faild to load Dict file");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  uVar1 = local_27c & 5;
  std::ifstream::~ifstream(&ifs);
  return uVar1 == 0;
}

Assistant:

bool Trie::loadDict(const char *filePath)
{
	ifstream ifs(filePath);
	if ( ! ifs ) {
		cout << "faild to load Dict file" << endl;
		return false;
	}
	string line;
	uint32_t w;
    Unicode _unicode;
	while ( !ifs.eof()) {
		ifs >> line >> w;
	    decode(line, _unicode);
        weightVect.push_back(w);
		lengthVect.push_back(_unicode.size());
		insert(_unicode);
		ifs.ignore(64, '\n');
	}
	ifs.close();
	return true;
}